

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

Status __thiscall
soplex::SPxSolverBase<double>::varStatusToBasisStatusCol
          (SPxSolverBase<double> *this,int col,VarStatus stat)

{
  Status SVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  switch(stat) {
  case ON_UPPER:
    SVar1 = P_ON_UPPER;
    break;
  case ON_LOWER:
    SVar1 = P_ON_LOWER;
    break;
  case FIXED:
    SVar1 = P_FIXED;
    break;
  case ZERO:
    SVar1 = P_FREE;
    break;
  case BASIC:
    SVar1 = SPxBasisBase<double>::dualColStatus(&this->super_SPxBasisBase<double>,col);
    return SVar1;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ESOLVE28 ERROR: unknown VarStatus (",0x23);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,stat);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    std::endl<char,std::char_traits<char>>(poVar2);
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"XSOLVE24 This should never happen.","");
    *puVar3 = &PTR__SPxException_0069d438;
    puVar3[1] = puVar3 + 3;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar3 + 1),local_40,local_40 + local_38);
    *puVar3 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar3,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  return SVar1;
}

Assistant:

typename SPxBasisBase<R>::Desc::Status
   SPxSolverBase<R>::varStatusToBasisStatusCol(int col,
         typename SPxSolverBase<R>::VarStatus stat) const
   {
      typename SPxBasisBase<R>::Desc::Status cstat;

      switch(stat)
      {
      case FIXED :
         cstat = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case ON_LOWER :
         cstat = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case ON_UPPER :
         cstat = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case ZERO :
         cstat = SPxBasisBase<R>::Desc::P_FREE;
         break;

      case BASIC :
         cstat = this->dualColStatus(col);
         break;

      default:
         SPX_MSG_ERROR(std::cerr << "ESOLVE28 ERROR: unknown VarStatus (" << int(stat) << ")"
                       << std::endl;)
         throw SPxInternalCodeException("XSOLVE24 This should never happen.");
      }

      return cstat;
   }